

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O2

bool tcu::floatThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference
               ,ConstPixelBufferAccess *result,Vec4 *threshold,CompareLogMode logMode)

{
  ostringstream *poVar1;
  TestLog *this;
  bool bVar2;
  TextureChannelClass TVar3;
  InternalError *this_00;
  Vec4 *bias;
  ConstPixelBufferAccess *pCVar4;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  int iVar5;
  string *this_01;
  int depth;
  int iVar6;
  int z;
  allocator<char> local_4e8;
  allocator<char> local_4e7;
  allocator<char> local_4e6;
  allocator<char> local_4e5;
  allocator<char> local_4e4;
  allocator<char> local_4e3;
  allocator<char> local_4e2;
  allocator<char> local_4e1;
  int local_4e0;
  int local_4dc;
  ConstPixelBufferAccess *local_4d8;
  Vec4 *local_4d0;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  Vec4 local_4b8;
  Vec4 local_4a8;
  char *local_490;
  char *local_488;
  ConstPixelBufferAccess *local_480;
  Vector<float,_4> local_478;
  TestLog *local_468;
  string local_460;
  string local_440;
  undefined1 local_420 [8];
  size_type sStack_418;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  PixelBufferAccess errorMask;
  TextureLevel errorMaskStorage;
  Vec4 diff;
  Vec4 cmpPix;
  Vec4 refPix;
  
  iVar5 = (reference->m_size).m_data[0];
  iVar6 = (reference->m_size).m_data[1];
  depth = (reference->m_size).m_data[2];
  refPix.m_data[0] = 9.80909e-45;
  refPix.m_data[1] = 4.2039e-45;
  local_4d8 = reference;
  local_4d0 = threshold;
  local_490 = imageSetDesc;
  local_488 = imageSetName;
  TextureLevel::TextureLevel(&errorMaskStorage,(TextureFormat *)&refPix,iVar5,iVar6,depth);
  TextureLevel::getAccess(&errorMask,&errorMaskStorage);
  local_478.m_data[0] = 0.0;
  local_478.m_data[1] = 0.0;
  local_478.m_data[2] = 0.0;
  local_478.m_data[3] = 0.0;
  local_4a8.m_data[0] = 0.0;
  local_4a8.m_data[1] = 0.0;
  local_4a8.m_data[2] = 0.0;
  local_4a8.m_data[3] = 0.0;
  local_4b8.m_data[0] = 1.0;
  local_4b8.m_data[1] = 1.0;
  local_4b8.m_data[2] = 1.0;
  local_4b8.m_data[3] = 1.0;
  local_468 = log;
  if ((((result->m_size).m_data[0] != iVar5) || ((result->m_size).m_data[1] != iVar6)) ||
     ((result->m_size).m_data[2] != depth)) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    InternalError::InternalError
              (this_00,(char *)0x0,
               "result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
               ,0x249);
    __cxa_throw(this_00,&InternalError::typeinfo,Exception::~Exception);
  }
  z = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  if (depth < 1) {
    depth = 0;
  }
  local_4c4 = depth;
  local_4c0 = iVar6;
  local_4bc = iVar5;
  local_480 = result;
  for (; z != local_4c4; z = z + 1) {
    iVar5 = 0;
    while (iVar5 != local_4c0) {
      local_4dc = iVar5;
      for (iVar6 = 0; iVar5 = local_4dc, local_4bc != iVar6; iVar6 = iVar6 + 1) {
        ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)&refPix,(int)local_4d8,iVar6,local_4dc);
        local_4e0 = iVar6;
        ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)&cmpPix,(int)local_480,iVar6,iVar5);
        operator-((tcu *)local_420,(Vector<float,_4> *)&refPix,(Vector<float,_4> *)&cmpPix);
        abs<float,4>((tcu *)&diff,(Vector<float,_4> *)local_420);
        lessThanEqual<float,4>((tcu *)local_420,(Vector<float,_4> *)&diff,local_4d0);
        bVar2 = boolAll<4>((Vector<bool,_4> *)local_420);
        max<float,4>((tcu *)local_420,&local_478,(Vector<float,_4> *)&diff);
        iVar6 = local_4e0;
        local_478.m_data[1] = (float)local_420._4_4_;
        local_478.m_data[0] = (float)local_420._0_4_;
        local_478.m_data[2] = (float)(undefined4)sStack_418;
        local_478.m_data[3] = (float)sStack_418._4_4_;
        local_420._4_4_ = 0.0;
        if (bVar2) {
          local_420._0_4_ = 0.0;
          local_420._4_4_ = 1.0;
        }
        else {
          local_420._0_4_ = 1.0;
        }
        sStack_418 = 0x3f80000000000000;
        PixelBufferAccess::setPixel(&errorMask,(Vec4 *)local_420,local_4e0,local_4dc,z);
      }
      iVar5 = local_4dc + 1;
    }
  }
  lessThanEqual<float,4>((tcu *)&refPix,&local_478,local_4d0);
  bVar2 = boolAll<4>((Vector<bool,_4> *)&refPix);
  this = local_468;
  pCVar4 = local_480;
  bias = (Vec4 *)(ulong)logMode;
  iVar5 = (int)local_468;
  if (logMode == COMPARE_LOG_EVERYTHING || !bVar2) {
    TVar3 = getTextureChannelClass((local_4d8->m_format).type);
    if (TVar3 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      TVar3 = getTextureChannelClass((pCVar4->m_format).type);
      if (TVar3 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) goto LAB_0095c0e7;
    }
    else {
LAB_0095c0e7:
      bias = &local_4a8;
      anon_unknown_50::computeScaleAndBias(local_4d8,pCVar4,&local_4b8,bias);
      poVar1 = (ostringstream *)(refPix.m_data + 2);
      refPix.m_data._0_8_ = this;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Result and reference images are normalized with formula p * ");
      operator<<((ostream *)poVar1,&local_4b8);
      std::operator<<((ostream *)poVar1," + ");
      operator<<((ostream *)poVar1,&local_4a8);
      MessageBuilder::operator<<((MessageBuilder *)&refPix,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    if (!bVar2) {
      poVar1 = (ostringstream *)(refPix.m_data + 2);
      refPix.m_data._0_8_ = this;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Image comparison failed: max difference = ");
      operator<<((ostream *)poVar1,&local_478);
      std::operator<<((ostream *)poVar1,", threshold = ");
      operator<<((ostream *)poVar1,local_4d0);
      MessageBuilder::operator<<((MessageBuilder *)&refPix,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,local_488,&local_4e1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,local_490,&local_4e2);
    LogImageSet::LogImageSet((LogImageSet *)local_420,&local_440,&local_460);
    LogImageSet::write((LogImageSet *)local_420,iVar5,__buf_01,(size_t)bias);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"Result",&local_4e3);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"Result",&local_4e4);
    LogImage::LogImage((LogImage *)&refPix,&local_380,&local_3a0,pCVar4,&local_4b8,&local_4a8,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)&refPix,iVar5,__buf_02,(size_t)pCVar4);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"Reference",&local_4e5);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"Reference",&local_4e6);
    pCVar4 = local_4d8;
    LogImage::LogImage((LogImage *)&cmpPix,&local_3c0,&local_3e0,local_4d8,&local_4b8,&local_4a8,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)&cmpPix,iVar5,__buf_03,(size_t)pCVar4);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"ErrorMask",&local_4e7);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"Error mask",&local_4e8)
    ;
    pCVar4 = &errorMask.super_ConstPixelBufferAccess;
    LogImage::LogImage((LogImage *)&diff,&local_340,&local_360,pCVar4,QP_IMAGE_COMPRESSION_MODE_BEST
                      );
    LogImage::write((LogImage *)&diff,iVar5,__buf_04,(size_t)pCVar4);
    TestLog::endImageSet(this);
    LogImage::~LogImage((LogImage *)&diff);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
    LogImage::~LogImage((LogImage *)&cmpPix);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
    LogImage::~LogImage((LogImage *)&refPix);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
    LogImageSet::~LogImageSet((LogImageSet *)local_420);
    std::__cxx11::string::~string((string *)&local_460);
    this_01 = &local_440;
  }
  else {
    if (logMode != COMPARE_LOG_RESULT) goto LAB_0095c428;
    if (((local_480->m_format).order != RGBA) || ((local_480->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(local_480,&local_4b8,&local_4a8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&diff,local_488,(allocator<char> *)&local_380);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_420,local_490,(allocator<char> *)&local_3a0);
    LogImageSet::LogImageSet((LogImageSet *)&cmpPix,(string *)&diff,(string *)local_420);
    LogImageSet::write((LogImageSet *)&cmpPix,iVar5,__buf,(size_t)bias);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"Result",(allocator<char> *)&local_3c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,"Result",(allocator<char> *)&local_3e0);
    LogImage::LogImage((LogImage *)&refPix,&local_440,&local_460,pCVar4,&local_4b8,&local_4a8,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)&refPix,iVar5,__buf_00,(size_t)pCVar4);
    TestLog::endImageSet(this);
    LogImage::~LogImage((LogImage *)&refPix);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_440);
    LogImageSet::~LogImageSet((LogImageSet *)&cmpPix);
    std::__cxx11::string::~string((string *)local_420);
    this_01 = (string *)&diff;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_0095c428:
  TextureLevel::~TextureLevel(&errorMaskStorage);
  return bVar2;
}

Assistant:

bool floatThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const Vec4& threshold, CompareLogMode logMode)
{
	int					width				= reference.getWidth();
	int					height				= reference.getHeight();
	int					depth				= reference.getDepth();
	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	Vec4				maxDiff				(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	TCU_CHECK_INTERNAL(result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth);

	for (int z = 0; z < depth; z++)
	{
		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				Vec4	refPix		= reference.getPixel(x, y, z);
				Vec4	cmpPix		= result.getPixel(x, y, z);

				Vec4	diff		= abs(refPix - cmpPix);
				bool	isOk		= boolAll(lessThanEqual(diff, threshold));

				maxDiff = max(maxDiff, diff);

				errorMask.setPixel(isOk ? Vec4(0.0f, 1.0f, 0.0f, 1.0f) : Vec4(1.0f, 0.0f, 0.0f, 1.0f), x, y, z);
			}
		}
	}

	bool compareOk = boolAll(lessThanEqual(maxDiff, threshold));

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(reference.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
			tcu::getTextureChannelClass(result.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(reference, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result and reference images are normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log << TestLog::Message << "Image comparison failed: max difference = " << maxDiff << ", threshold = " << threshold << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}